

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O0

void __thiscall Coin::Serialize<DataStream>(Coin *this,DataStream *s)

{
  long lVar1;
  bool bVar2;
  CTxOut *in_RSI;
  long in_FS_OFFSET;
  uint32_t code;
  Coin *in_stack_ffffffffffffffb8;
  CTxOut *os;
  uint *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsSpent(in_stack_ffffffffffffffb8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!IsSpent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/coins.h"
                  ,0x3f,"void Coin::Serialize(Stream &) const [Stream = DataStream]");
  }
  os = in_RSI;
  Using<VarIntFormatter<(VarIntMode)0>,unsigned_int&>(in_stack_ffffffffffffffc0);
  Serialize<DataStream,_Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&>_>
            ((DataStream *)os,(Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> *)0x75cdba);
  Using<TxOutCompression,CTxOut_const&>(in_RSI);
  Serialize<DataStream,_Wrapper<TxOutCompression,_const_CTxOut_&>_>
            ((DataStream *)os,(Wrapper<TxOutCompression,_const_CTxOut_&> *)0x75cde2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream &s) const {
        assert(!IsSpent());
        uint32_t code = nHeight * uint32_t{2} + fCoinBase;
        ::Serialize(s, VARINT(code));
        ::Serialize(s, Using<TxOutCompression>(out));
    }